

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
QueryCompiler::compileViews
          (QueryCompiler *this,TDNode *node,size_t destinationID,
          vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *aggregate,
          var_bitset freeVars)

{
  pointer pbVar1;
  Function *pFVar2;
  View *pVVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  _WordT _Var6;
  _WordT _Var7;
  _WordT _Var8;
  bool bVar9;
  Aggregate *pAVar10;
  bool bVar11;
  iterator iVar12;
  iterator iVar13;
  bitset<200UL> *pbVar14;
  mapped_type *pmVar15;
  __node_base _Var16;
  size_t sVar17;
  TDNode *node_00;
  iterator iVar18;
  void *pvVar19;
  mapped_type *pmVar20;
  mapped_type *pmVar21;
  size_t prod;
  unsigned_long uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t *__head;
  prod_bitset *this_00;
  long lVar25;
  size_t f;
  unsigned_long uVar26;
  long lVar27;
  ulong __position;
  size_t i;
  _Base_bitset<24UL> *p_Var28;
  initializer_list<std::bitset<1500UL>_> __l;
  bitset<100UL> bVar29;
  pair<unsigned_long,_unsigned_long> pVar30;
  ulong local_790;
  Aggregate *agg;
  size_t destinationID_local;
  bitset<100UL> *local_778;
  _Base_bitset<4UL> *local_770;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> pushDownMask;
  var_bitset freeVars_local;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> pushDownFreeVars;
  agg_bitset candidate;
  agg_bitset merges;
  unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
  localAggMap;
  prod_bitset forcedLocal;
  _Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> local_5c0;
  cache_tuple t;
  View *view;
  pointer local_570;
  bitset<1500UL> __result_5;
  prod_bitset localMask;
  _Base_bitset<24UL> local_330;
  prod_bitset forcedLocalFunctions;
  prod_bitset presentFunctions;
  prod_bitset remainderMask;
  
  freeVars_local.super__Base_bitset<2UL>._M_w[1] = freeVars.super__Base_bitset<2UL>._M_w[1];
  freeVars_local.super__Base_bitset<2UL>._M_w[0] = freeVars.super__Base_bitset<2UL>._M_w[0];
  __head = &node->_id;
  destinationID_local = destinationID;
  std::
  _Tuple_impl<0ul,unsigned_long,unsigned_long,std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>,std::bitset<100ul>>
  ::
  _Tuple_impl<unsigned_long&,unsigned_long&,std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>&,std::bitset<100ul>&,void>
            ((_Tuple_impl<0ul,unsigned_long,unsigned_long,std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>,std::bitset<100ul>>
              *)&localMask,__head,&destinationID_local,aggregate,&freeVars_local);
  std::
  tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  ::
  tuple<unsigned_long,_unsigned_long,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>,_true,_true>
            (&t,(tuple<unsigned_long,_unsigned_long,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
                 *)&localMask);
  std::_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~_Vector_base
            ((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             (localMask.super__Base_bitset<24UL>._M_w + 2));
  iVar12 = std::
           _Hashtable<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->_cache)._M_h,&t);
  if (iVar12.
      super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
              (&pushDownMask,node->_numOfNeighbors,(allocator_type *)&localMask);
    lVar25 = 0;
    memset(&localMask,0,0xc0);
    memset(&forcedLocalFunctions,0,0xc0);
    memset(&remainderMask,0,0xc0);
    memset(&presentFunctions.super__Base_bitset<24UL>,0,0xc0);
    for (uVar23 = 0;
        pbVar1 = (aggregate->
                 super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        uVar23 < (ulong)(((long)(aggregate->
                                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) / 0xc0);
        uVar23 = uVar23 + 1) {
      std::_Base_bitset<24UL>::_M_do_or
                (&presentFunctions.super__Base_bitset<24UL>,
                 (_Base_bitset<24UL> *)((long)(pbVar1->super__Base_bitset<24UL>)._M_w + lVar25));
      lVar25 = lVar25 + 0xc0;
    }
    local_778 = &node->_bag;
    for (uVar23 = 0; this_00 = &localMask, uVar23 != 0x5dc; uVar23 = uVar23 + 1) {
      if ((presentFunctions.super__Base_bitset<24UL>._M_w[uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0)
      {
        pFVar2 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar23];
        bVar29 = std::operator&(local_778,&pFVar2->_fVars);
        if ((bVar29.super__Base_bitset<2UL>._M_w[0] !=
             (pFVar2->_fVars).super__Base_bitset<2UL>._M_w[0]) ||
           (bVar29.super__Base_bitset<2UL>._M_w[1] !=
            (pFVar2->_fVars).super__Base_bitset<2UL>._M_w[1])) {
          lVar27 = 0;
          lVar25 = 0;
          for (uVar24 = 0; uVar24 < node->_numOfNeighbors; uVar24 = uVar24 + 1) {
            if ((node->_neighbors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar24] != destinationID_local) {
              bVar29 = std::operator&((bitset<100UL> *)
                                      ((long)(node->_neighborSchema->super__Base_bitset<2UL>)._M_w +
                                      lVar27),&pFVar2->_fVars);
              if ((bVar29.super__Base_bitset<2UL>._M_w[0] ==
                   (pFVar2->_fVars).super__Base_bitset<2UL>._M_w[0]) &&
                 (bVar29.super__Base_bitset<2UL>._M_w[1] ==
                  (pFVar2->_fVars).super__Base_bitset<2UL>._M_w[1])) {
                std::bitset<1500UL>::set
                          ((bitset<1500UL> *)
                           ((long)((pushDownMask.
                                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Base_bitset<24UL>)._M_w + lVar25),uVar23,true);
                std::bitset<1500UL>::set(&remainderMask,uVar23,true);
                goto LAB_001dd96b;
              }
            }
            lVar25 = lVar25 + 0xc0;
            lVar27 = lVar27 + 0x10;
          }
          std::bitset<1500UL>::set(&localMask,uVar23,true);
          this_00 = &forcedLocalFunctions;
        }
        std::bitset<1500UL>::set(this_00,uVar23,true);
      }
LAB_001dd96b:
    }
    std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::vector
              (&pushDownFreeVars,
               ((long)(aggregate->
                      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(aggregate->
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc0,&freeVars_local,
               (allocator_type *)&forcedLocal);
    localAggMap._M_h._M_buckets = &localAggMap._M_h._M_single_bucket;
    localAggMap._M_h._M_bucket_count = 1;
    localAggMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    localAggMap._M_h._M_element_count = 0;
    localAggMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    localAggMap._M_h._M_rehash_policy._M_next_resize = 0;
    localAggMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
    for (uVar23 = 0;
        pbVar1 = (aggregate->
                 super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        uVar23 < (ulong)(((long)(aggregate->
                                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) / 0xc0);
        uVar23 = uVar23 + 1) {
      memcpy(&forcedLocal.super__Base_bitset<24UL>,pbVar1 + uVar23,0xc0);
      std::_Base_bitset<24UL>::_M_do_and
                (&forcedLocal.super__Base_bitset<24UL>,
                 &forcedLocalFunctions.super__Base_bitset<24UL>);
      for (uVar24 = 0; uVar24 != 0x5dc; uVar24 = uVar24 + 1) {
        if ((forcedLocal.super__Base_bitset<24UL>._M_w[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0) {
          pFVar2 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar24];
          __result_5.super__Base_bitset<24UL>._M_w._0_16_ = std::bitset<100UL>::operator~(local_778)
          ;
          _view = (_WordT  [2])std::operator&(&pFVar2->_fVars,(bitset<100UL> *)&__result_5);
          std::_Base_bitset<2UL>::_M_do_or
                    (&pushDownFreeVars.
                      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar23].super__Base_bitset<2UL>,
                     (_Base_bitset<2UL> *)&view);
        }
      }
      memcpy((_Base_bitset<24UL> *)&view,
             (aggregate->
             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)._M_impl
             .super__Vector_impl_data._M_start + uVar23,0xc0);
      std::_Base_bitset<24UL>::_M_do_and
                ((_Base_bitset<24UL> *)&view,&localMask.super__Base_bitset<24UL>);
      iVar13 = std::
               _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&localAggMap._M_h,(key_type *)&view);
      if (iVar13.
          super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        __result_5.super__Base_bitset<24UL>._M_w[2] = 0;
        __result_5.super__Base_bitset<24UL>._M_w[3] = 0;
        __result_5.super__Base_bitset<24UL>._M_w._0_16_ = ZEXT816(0);
        pbVar14 = std::bitset<200UL>::set((bitset<200UL> *)&__result_5,uVar23,true);
        pmVar15 = std::__detail::
                  _Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&localAggMap,(key_type *)&view);
        _Var6 = (pbVar14->super__Base_bitset<4UL>)._M_w[0];
        _Var7 = (pbVar14->super__Base_bitset<4UL>)._M_w[1];
        _Var8 = (pbVar14->super__Base_bitset<4UL>)._M_w[3];
        (pmVar15->super__Base_bitset<4UL>)._M_w[2] = (pbVar14->super__Base_bitset<4UL>)._M_w[2];
        (pmVar15->super__Base_bitset<4UL>)._M_w[3] = _Var8;
        (pmVar15->super__Base_bitset<4UL>)._M_w[0] = _Var6;
        (pmVar15->super__Base_bitset<4UL>)._M_w[1] = _Var7;
      }
      else {
        std::bitset<200UL>::set
                  ((bitset<200UL> *)
                   ((long)iVar13.
                          super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false>
                          ._M_cur + 200),uVar23,true);
      }
    }
    agg = (Aggregate *)operator_new(0x30);
    (agg->_incoming).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (agg->_incoming).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (agg->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (agg->_incoming).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (agg->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (agg->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (_Var16 = localAggMap._M_h._M_before_begin; _Var16._M_nxt != (_Hash_node_base *)0x0;
        _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt) {
      local_770 = (_Base_bitset<4UL> *)(_Var16._M_nxt + 0x19);
      for (uVar23 = 0; uVar23 != 200; uVar23 = uVar23 + 1) {
        if ((local_770->_M_w[uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0) {
          std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                    (&agg->_agg,(value_type *)(_Var16._M_nxt + 1));
          merges.super__Base_bitset<4UL>._M_w[2] = 0;
          merges.super__Base_bitset<4UL>._M_w[3] = 0;
          merges.super__Base_bitset<4UL>._M_w[0] = 0;
          merges.super__Base_bitset<4UL>._M_w[1] = 0;
          candidate.super__Base_bitset<4UL>._M_w[0] = local_770->_M_w[0];
          candidate.super__Base_bitset<4UL>._M_w[1] = local_770->_M_w[1];
          candidate.super__Base_bitset<4UL>._M_w[2] = local_770->_M_w[2];
          candidate.super__Base_bitset<4UL>._M_w[3] = local_770->_M_w[3];
          sVar17 = std::_Base_bitset<4UL>::_M_do_count(local_770);
          if (sVar17 < 2) {
            local_790 = 0;
            bVar9 = false;
          }
          else {
            local_790 = 0;
            bVar9 = false;
LAB_001ddc67:
            uVar24 = uVar23;
            if (local_790 < node->_numOfNeighbors) {
              do {
                lVar25 = uVar24 * 0xc0;
                do {
                  do {
                    lVar27 = lVar25;
                    uVar24 = uVar24 + 1;
                    if (uVar24 == 200) {
                      if (bVar9) goto LAB_001dde4d;
                      local_790 = local_790 + 1;
                      goto LAB_001ddc67;
                    }
                    lVar25 = lVar27 + 0xc0;
                  } while ((candidate.super__Base_bitset<4UL>._M_w[uVar24 >> 6] >> (uVar24 & 0x3f) &
                           1) == 0);
                  p_Var28 = &pushDownMask.
                             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_790].
                             super__Base_bitset<24UL>;
                  memcpy(&forcedLocal.super__Base_bitset<24UL>,
                         (aggregate->
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar23,0xc0);
                  std::_Base_bitset<24UL>::_M_do_and(&forcedLocal.super__Base_bitset<24UL>,p_Var28);
                  p_Var28 = &pushDownMask.
                             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_790].
                             super__Base_bitset<24UL>;
                  memcpy((_Base_bitset<24UL> *)&view,
                         (void *)((long)(aggregate->
                                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[1].
                                        super__Base_bitset<24UL>._M_w + lVar27),0xc0);
                  std::_Base_bitset<24UL>::_M_do_and((_Base_bitset<24UL> *)&view,p_Var28);
                  bVar11 = std::bitset<1500UL>::operator!=
                                     ((bitset<1500UL> *)&forcedLocal.super__Base_bitset<24UL>,
                                      (bitset<1500UL> *)&view);
                } while (!bVar11);
                pbVar1 = (aggregate->
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                std::bitset<1500UL>::operator~
                          ((bitset<1500UL> *)&view,
                           pushDownMask.
                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_790);
                memcpy(&forcedLocal.super__Base_bitset<24UL>,pbVar1 + uVar23,0xc0);
                std::_Base_bitset<24UL>::_M_do_and
                          (&forcedLocal.super__Base_bitset<24UL>,(_Base_bitset<24UL> *)&view);
                pbVar1 = (aggregate->
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                std::bitset<1500UL>::operator~
                          ((bitset<1500UL> *)&local_330,
                           pushDownMask.
                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_790);
                memcpy(&__result_5.super__Base_bitset<24UL>,
                       (void *)((long)pbVar1[1].super__Base_bitset<24UL>._M_w + lVar27),0xc0);
                std::_Base_bitset<24UL>::_M_do_and(&__result_5.super__Base_bitset<24UL>,&local_330);
                bVar11 = std::_Base_bitset<24UL>::_M_is_equal
                                   (&forcedLocal.super__Base_bitset<24UL>,
                                    &__result_5.super__Base_bitset<24UL>);
                if (bVar11) {
                  bVar9 = true;
                  std::bitset<200UL>::set(&merges,uVar24,true);
                }
                std::bitset<200UL>::reset(&candidate,uVar24);
              } while( true );
            }
          }
LAB_001dde4d:
          for (uVar24 = 0; uVar24 < node->_numOfNeighbors; uVar24 = uVar24 + 1) {
            if ((node->_neighbors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar24] != destinationID_local) {
              p_Var28 = &pushDownMask.
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar24].super__Base_bitset<24UL>;
              memcpy(&forcedLocal.super__Base_bitset<24UL>,
                     (aggregate->
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)
                     ._M_impl.super__Vector_impl_data._M_start + uVar23,0xc0);
              std::_Base_bitset<24UL>::_M_do_and(&forcedLocal.super__Base_bitset<24UL>,p_Var28);
              __l._M_len = 1;
              __l._M_array = (iterator)&forcedLocal.super__Base_bitset<24UL>;
              std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                        ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)&view
                         ,__l,(allocator_type *)&__result_5);
              if (uVar24 == local_790 && !(bool)(~bVar9 & 1)) {
                lVar25 = 0;
                for (__position = 0; __position != 200; __position = __position + 1) {
                  if ((merges.super__Base_bitset<4UL>._M_w[__position >> 6] >> (__position & 0x3f) &
                      1) != 0) {
                    p_Var28 = &pushDownMask.
                               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_790].
                               super__Base_bitset<24UL>;
                    memcpy(&forcedLocal.super__Base_bitset<24UL>,
                           (void *)((long)(((aggregate->
                                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                          super__Base_bitset<24UL>)._M_w + lVar25),0xc0);
                    std::_Base_bitset<24UL>::_M_do_and
                              (&forcedLocal.super__Base_bitset<24UL>,p_Var28);
                    std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
                    emplace_back<std::bitset<1500ul>>
                              ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                               &view,(bitset<1500UL> *)&forcedLocal.super__Base_bitset<24UL>);
                    std::bitset<200UL>::reset((bitset<200UL> *)local_770,__position);
                  }
                  lVar25 = lVar25 + 0xc0;
                }
              }
              node_00 = TreeDecomposition::getRelation
                                  ((this->_td).
                                   super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(node->_neighbors).
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar24]);
              __result_5.super__Base_bitset<24UL>._M_w._0_16_ =
                   std::operator|(&freeVars_local,
                                  pushDownFreeVars.
                                  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar23);
              forcedLocal.super__Base_bitset<24UL>._M_w._0_16_ =
                   std::operator&((bitset<100UL> *)&__result_5,node->_neighborSchema + uVar24);
              local_330._M_w._0_16_ = std::operator&(&node_00->_bag,local_778);
              bVar29 = std::operator|((bitset<100UL> *)&forcedLocal,(bitset<100UL> *)&local_330);
              pAVar10 = agg;
              sVar17 = node->_id;
              std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                        ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                         &local_5c0,
                         (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)&view
                        );
              forcedLocal.super__Base_bitset<24UL>._M_w._0_16_ =
                   compileViews(this,node_00,sVar17,
                                (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                 *)&local_5c0,(var_bitset)bVar29.super__Base_bitset<2UL>._M_w);
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)&pAVar10->_incoming,(pair<unsigned_long,_unsigned_long> *)&forcedLocal);
              std::_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
              ~_Vector_base(&local_5c0);
              std::_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
              ~_Vector_base((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                             *)&view);
            }
          }
        }
      }
    }
    forcedLocal.super__Base_bitset<24UL>._M_w[1] = freeVars_local.super__Base_bitset<2UL>._M_w[1];
    forcedLocal.super__Base_bitset<24UL>._M_w[0] = freeVars_local.super__Base_bitset<2UL>._M_w[0];
    forcedLocal.super__Base_bitset<24UL>._M_w[2]._4_4_ = (undefined4)*__head;
    forcedLocal.super__Base_bitset<24UL>._M_w[2]._0_4_ = (undefined4)destinationID_local;
    iVar18 = std::
             _Hashtable<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->_viewCache)._M_h,(key_type *)&forcedLocal);
    if (iVar18.
        super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      pvVar19 = operator_new(0x38);
      *(int *)((long)pvVar19 + 4) = (int)*__head;
      *(undefined4 *)((long)pvVar19 + 8) = (undefined4)destinationID_local;
      view = (View *)pvVar19;
      *(undefined8 *)((long)pvVar19 + 0x30) = 0;
      *(undefined8 *)((long)pvVar19 + 0x20) = 0;
      *(undefined8 *)((long)pvVar19 + 0x28) = 0;
      *(_WordT *)((long)pvVar19 + 0x10) = freeVars_local.super__Base_bitset<2UL>._M_w[0];
      *(_WordT *)((long)pvVar19 + 0x18) = freeVars_local.super__Base_bitset<2UL>._M_w[1];
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)((long)pvVar19 + 0x20),&agg);
      std::vector<View_*,_std::allocator<View_*>_>::push_back(&this->_viewList,&view);
      ppVVar4 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar5 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pmVar20 = std::__detail::
                _Map_base<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->_viewCache,(key_type *)&forcedLocal);
      *pmVar20 = (int)((ulong)((long)ppVVar5 - (long)ppVVar4) >> 3) + -1;
      uVar26 = ((long)(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) - 1;
      uVar22 = 0;
    }
    else {
      pVVar3 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
               super__Vector_impl_data._M_start
               [*(int *)((long)iVar18.
                               super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
                               ._M_cur + 0x20)];
      view = pVVar3;
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back(&pVVar3->_aggregates,&agg);
      uVar22 = ((long)*(pointer *)
                       ((long)&(pVVar3->_aggregates).
                               super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl
                       + 8) -
                *(long *)&(pVVar3->_aggregates).
                          super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                          super__Vector_impl_data >> 3) - 1;
      uVar26 = (unsigned_long)
               *(int *)((long)iVar18.
                              super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
                              ._M_cur + 0x20);
    }
    pmVar21 = std::__detail::
              _Map_base<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->_cache,&t);
    pmVar21->first = (int)uVar26;
    pmVar21->second = (int)uVar22;
    std::
    _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&localAggMap._M_h);
    std::_Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::~_Vector_base
              (&pushDownFreeVars.
                super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>);
    std::_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~_Vector_base
              (&pushDownMask.
                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>);
  }
  else {
    uVar26 = (unsigned_long)
             *(int *)((long)iVar12.
                            super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
                            ._M_cur + 0x38);
    uVar22 = (unsigned_long)
             *(int *)((long)iVar12.
                            super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
                            ._M_cur + 0x3c);
  }
  std::_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~_Vector_base
            ((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             &t.
              super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
              .
              super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
              .
              super__Tuple_impl<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
              .
              super__Head_base<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_false>
            );
  pVar30.second = uVar22;
  pVar30.first = uVar26;
  return pVar30;
}

Assistant:

pair<size_t,size_t> QueryCompiler::compileViews(TDNode* node, size_t destinationID,
                                   vector<prod_bitset> aggregate, var_bitset freeVars)
{
    bool print = false;
    
    /* Check if the required view has already been declared - if so reuse this one */
    cache_tuple t = make_tuple(node->_id, destinationID, aggregate, freeVars);
    auto it = _cache.find(t);
    if (it != _cache.end())
    {
        if (print) 
            DINFO("We reused an existing view. \n");      
        return it->second;
    }

    
    if (print)
    {
        DINFO("\nBeginning compileViews at node " + to_string(node->_id) + " destination "+
              to_string(destinationID) + " freeVars: " + freeVars.to_string() +
              " number of products: " + to_string(aggregate.size()) +"\n");

        std::string aggString = " ";
        size_t aggIdx = 0;
        for (size_t i = 0; i < aggregate.size(); i++) {
            const auto &prod = aggregate[aggIdx];
            for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++) {
                if (prod.test(f)) {
                    Function* func = getFunction(f);
                    aggString += "f_"+to_string(f)+"(";
                    for (size_t i = 0; i < NUM_OF_VARIABLES; i++)
                        if (func->_fVars.test(i))
                            aggString += _td->getAttribute(i)->_name;
                    aggString += ")*";
                }
            }
            aggString.pop_back();
            aggString += " + ";
            ++aggIdx;
        }
        aggString.pop_back();
        printf("%s\n", aggString.c_str());
    }
    
    vector<prod_bitset> pushDownMask(node->_numOfNeighbors);
    prod_bitset localMask, forcedLocalFunctions, remainderMask, presentFunctions;

    // Find all functions in the aggregate 
    for (size_t prod = 0; prod < aggregate.size(); prod++)
        presentFunctions |= aggregate[prod];

    for (size_t i = 0; i < NUM_OF_FUNCTIONS; i++)
    {
        if (presentFunctions[i])
        {            
            const var_bitset& fVars = _functionList[i]->_fVars;
            bool pushedDown = false;

            /*
             * Check if that function is included in the local bag
             * - if so, then we do not push it down 
             */
            if ((node->_bag & fVars) == fVars)
            {
                /* Leave it here as local computation */
                localMask.set(i);
            }
            else
            {
                /* For each child of current node */
                for (size_t c = 0; c < node->_numOfNeighbors; c++)
                {
                    /* chekc that this neighbor is not the destination */
                    if (node->_neighbors[c] != destinationID)
                    {
                        /* childSchema contains the function then push down */
                        if ((node->_neighborSchema[c] & fVars) == fVars)
                        {
                            /* push it to this child */
                            pushDownMask[c].set(i);
                            remainderMask.set(i);
                            pushedDown = true;
                            break;
                        }
                    }
                }

                if (!pushedDown)
                {
                    /* Leave it here as local computation */
                    localMask.set(i);
                    forcedLocalFunctions.set(i);
                }
            }
        }
    }
    
    vector<var_bitset> pushDownFreeVars(aggregate.size(), freeVars);
    
    std::unordered_map<prod_bitset, agg_bitset> localAggMap;


    /* 
     * For each product - split the functions into the ones that are pushed down
     * and the local functions 
     */
    for (size_t prod = 0; prod < aggregate.size(); prod++)
    {
        // Add freeVars that do not exist in local bag to pushDownFreeVars
        prod_bitset forcedLocal = aggregate[prod] & forcedLocalFunctions;
        
        for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
        {
            if (forcedLocal[f])
            {
                pushDownFreeVars[prod] |=
                    _functionList[f]->_fVars & ~node->_bag;
            }
        }
        
        prod_bitset localAggregate = aggregate[prod] & localMask;
        
        // add this product to localAggregates
        auto it = localAggMap.find(localAggregate);
        if (it != localAggMap.end())
        {
            it->second.set(prod);
        }
        else
        {
            localAggMap[localAggregate] = agg_bitset().set(prod);
        }
    }
  
    if (print)
    {
        size_t localAggIndex = 0;
        for (pair<const prod_bitset, agg_bitset>& localAgg : localAggMap)
            std::cout << localAggIndex++ << " : " << localAgg.first 
                      << " -> " << localAgg.second << std::endl;
    }


    Aggregate* agg = new Aggregate();

    /* 
     * We now computed the local aggregates and the groups of products they
     * correspond to - now we check if we can merge several products before the
     * recursion 
     */
    size_t localAggIndex = 0;
    for (pair<const prod_bitset, agg_bitset>& localAgg : localAggMap)
    {
        if (print)
            std::cout << localAggIndex++ << " : " << localAgg.first 
                      << " -> " << localAgg.second << std::endl;
        
        for (size_t prod = 0; prod < NUM_OF_PRODUCTS; ++prod)
        {
            if (localAgg.second[prod])
            {
                if (print)
                    std::cout << prod << std::endl;
                
                // Push local aggregate on aggregate
                agg->_agg.push_back(localAgg.first);
                
                size_t neigh = 0;
                bool mergable = false;

                // Check if we can merge some of the products that need to be
                // computed below
                agg_bitset merges, candidate = localAgg.second;

                if (localAgg.second.count() > 1)
                {
                    for (neigh = 0; neigh < node->_numOfNeighbors; ++neigh)
                    {
                        for (size_t other_prod = prod+1; other_prod < NUM_OF_PRODUCTS;
                             ++other_prod)
                        {
                            if (candidate[other_prod])
                            {
                                if ((aggregate[prod] & pushDownMask[neigh]) !=
                                    (aggregate[other_prod] & pushDownMask[neigh]))
                                {
                                    if ((aggregate[prod] & ~pushDownMask[neigh]) ==
                                        (aggregate[other_prod] & ~pushDownMask[neigh]))
                                    {
                                        merges.set(other_prod);
                                        mergable = true;
                                    }

                                    candidate.reset(other_prod);
                                }
                            }
                        }

                        if (mergable)
                            break;                        
                    }
                }

                // For each neighbor compile the (merged) views and push to incoming
                for (size_t n = 0; n < node->_numOfNeighbors; ++n)
                {
                    if (node->_neighbors[n] != destinationID)
                    {
                        vector<prod_bitset> childAgg =
                            {aggregate[prod] & pushDownMask[n]};
                        
                        if (mergable && n == neigh)
                        {  
                            for (size_t other = 0; other < NUM_OF_PRODUCTS; ++other)
                            {
                                if (merges[other])
                                {     
                                    /* Add mergable products to this array */
                                    childAgg.push_back(
                                        aggregate[other] & pushDownMask[n]);
                                    
                                    /* And unset for the flag in localAgg.second */
                                    localAgg.second.reset(other);
                                }
                            }
                        }

                        TDNode* neighbor = _td->getRelation(node->_neighbors[n]);

                        var_bitset neighborFreeVars =
                            ((freeVars | pushDownFreeVars[prod]) &
                             node->_neighborSchema[n]) |
                            (neighbor->_bag & node->_bag);

                        /* Recursive call for the next child */ 
                        agg->_incoming.push_back(
                             compileViews(neighbor, node->_id, childAgg, neighborFreeVars));
                    }
                }
            }
        }
    }

    /* 
     * Check here if a View with the same node, destination and freeVars exists 
     * if so then we want to append this aggregate to the exisiting view
     */
    View* view;
    view_tuple vt = make_tuple(node->_id, destinationID, freeVars);
    pair<size_t, size_t> viewAggregatePair;
    
    auto view_it = _viewCache.find(vt);
    if (view_it != _viewCache.end())
    {
        /* If the required view has already been declared, we append the
         * aggregate to this view 
         */

        view = _viewList[view_it->second];
        
        view->_aggregates.push_back(agg);

        /* Used for caching entire view and aggregate */
        viewAggregatePair =  make_pair(view_it->second, view->_aggregates.size()-1);
    }
    else
    {
        /* 
         * If the required view has not already been declared, we construct a
         * new view and the aggregate to it
         */
        view = new View(node->_id, destinationID);
        
        view->_fVars = freeVars;
        view->_aggregates.push_back(agg);

        /* Adding local view to the list of views */
        _viewList.push_back(view);

        /* Cache this view structure */
        _viewCache[vt] = _viewList.size()-1;

        /* Used for caching entire view and aggregate */
        viewAggregatePair =  make_pair(_viewList.size()-1, 0);
    }
    
    /* Adding the  view for the entire subtree to the cache */ 
    _cache[t] = viewAggregatePair;
    
    /* Return ID of this view */  
    return viewAggregatePair;    
}